

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache_test.cc
# Opt level: O2

void TemplateCacheUnittest::TestRecursiveInclude(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  long lVar3;
  string incname;
  TemplateDictionary dict;
  TemplateCache cache;
  allocator local_139;
  TemplateString local_138;
  string local_118;
  pointer local_f8;
  size_type sStack_f0;
  undefined1 local_e8;
  uint7 uStack_e7;
  undefined8 uStack_e0;
  TemplateString local_d8;
  string local_b8 [3];
  TemplateString local_48 [2];
  
  ctemplate::TemplateCache::TemplateCache((TemplateCache *)local_48);
  std::__cxx11::string::string
            ((string *)local_b8,"hi {{>INC}} bar\n  {{>INC}}!",(allocator *)&local_138);
  ctemplate::StringToTemplateFile(&local_118,local_b8);
  std::__cxx11::string::~string((string *)local_b8);
  local_b8[0]._M_dataplus._M_p = local_118._M_dataplus._M_p;
  local_b8[0]._M_string_length = local_118._M_string_length;
  local_b8[0].field_2._M_local_buf[0] = '\0';
  local_b8[0].field_2._8_8_ = 0;
  lVar3 = ctemplate::TemplateCache::GetTemplate(local_48,(Strip)local_b8);
  if (lVar3 != 0) {
    ctemplate::TemplateString::TemplateString(&local_138,"dict");
    ctemplate::TemplateDictionary::TemplateDictionary
              ((TemplateDictionary *)local_b8,&local_138,(UnsafeArena *)0x0);
    ctemplate::TemplateString::TemplateString(&local_d8,"INC");
    TVar1.length_ = local_d8.length_;
    TVar1.ptr_ = local_d8.ptr_;
    TVar1.is_immutable_ = local_d8.is_immutable_;
    TVar1._17_7_ = local_d8._17_7_;
    TVar1.id_ = local_d8.id_;
    ctemplate::TemplateDictionary::AddIncludeDictionary(TVar1);
    local_f8 = local_118._M_dataplus._M_p;
    sStack_f0 = local_118._M_string_length;
    local_e8 = 0;
    uStack_e0 = 0;
    TVar2.length_ = local_118._M_string_length;
    TVar2.ptr_ = local_118._M_dataplus._M_p;
    TVar2._16_8_ = (ulong)uStack_e7 << 8;
    TVar2.id_ = 0;
    ctemplate::TemplateDictionary::SetFilename(TVar2);
    std::__cxx11::string::string
              ((string *)&local_138,"hi hi  bar\n  ! bar\n  hi  bar\n    !!",&local_139);
    ctemplate::AssertExpandWithCacheIs
              ((TemplateCache *)local_48,&local_118,DO_NOT_STRIP,(TemplateDictionary *)local_b8,
               (PerExpandData *)0x0,(string *)&local_138,true);
    std::__cxx11::string::~string((string *)&local_138);
    ctemplate::TemplateDictionary::~TemplateDictionary((TemplateDictionary *)local_b8);
    std::__cxx11::string::~string((string *)&local_118);
    ctemplate::TemplateCache::~TemplateCache((TemplateCache *)local_48);
    return;
  }
  printf("ASSERT FAILED, line %d: %s\n",0x390,"tpl");
  __assert_fail("tpl",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                ,0x390,"static void TemplateCacheUnittest::TestRecursiveInclude()");
}

Assistant:

static void TestRecursiveInclude() {
    TemplateCache cache;
    string incname = StringToTemplateFile("hi {{>INC}} bar\n  {{>INC}}!");
    const Template* tpl = cache.GetTemplate(incname, DO_NOT_STRIP);
    ASSERT(tpl);
    TemplateDictionary dict("dict");
    dict.AddIncludeDictionary("INC")->SetFilename(incname);
    // Note the last line is indented 4 spaces instead of 2.  This is
    // because the last sub-include is indented.
    AssertExpandWithCacheIs(&cache, incname, DO_NOT_STRIP, &dict, NULL,
                            "hi hi  bar\n  ! bar\n  hi  bar\n    !!",
                            true);
  }